

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseDefault(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  ObjSense OVar1;
  bool bVar2;
  Parsekey PVar3;
  int iVar4;
  bool skip;
  size_t e;
  string strline;
  string sense;
  size_t s;
  string word;
  
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  bVar2 = getMpsLine(this,file,&strline,&skip);
  if (!bVar2) {
    PVar3 = kFail;
    goto LAB_00226dd9;
  }
  if (skip != false) {
    PVar3 = kComment;
    goto LAB_00226dd9;
  }
  bVar2 = timeout(this);
  if (bVar2) {
    PVar3 = kTimeout;
    goto LAB_00226dd9;
  }
  PVar3 = checkFirstWord(this,&strline,&s,&e,&word);
  if (PVar3 != kObjsense) {
    if (PVar3 == kName) {
      if (e < strline._M_string_length) {
        first_word(&sense,&strline,e);
        std::__cxx11::string::operator=((string *)&this->mps_name,(string *)&sense);
        std::__cxx11::string::~string((string *)&sense);
      }
      highsLogDev(log_options,kInfo,"readMPS: Read NAME    OK\n");
      PVar3 = kNone;
    }
    goto LAB_00226dd9;
  }
  PVar3 = kObjsense;
  if (strline._M_string_length <= e) goto LAB_00226dd9;
  first_word(&sense,&strline,e);
  toupper((int)&sense);
  iVar4 = std::__cxx11::string::compare((char *)&sense);
  if (iVar4 == 0) {
    OVar1 = kMaximize;
LAB_00226edf:
    this->obj_sense = OVar1;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&sense);
    if (iVar4 == 0) {
      OVar1 = kMinimize;
      goto LAB_00226edf;
    }
  }
  std::__cxx11::string::~string((string *)&sense);
LAB_00226dd9:
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::string::~string((string *)&strline);
  return PVar3;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseDefault(const HighsLogOptions& log_options,
                                      std::istream& file) {
  std::string strline, word;
  bool skip;
  if (getMpsLine(file, strline, skip)) {
    if (skip) return HMpsFF::Parsekey::kComment;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t s, e;
    HMpsFF::Parsekey key = checkFirstWord(strline, s, e, word);
    if (key == HMpsFF::Parsekey::kName) {
      // Save name of the MPS file
      if (e < strline.length()) {
        mps_name = first_word(strline, e);
      }
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read NAME    OK\n");
      return HMpsFF::Parsekey::kNone;
    }

    if (key == HMpsFF::Parsekey::kObjsense) {
      // Look for Gurobi-style definition of MAX/MIN on OBJSENSE line
      if (e < strline.length()) {
        std::string sense = first_word(strline, e);
        // Convert to upper case
        toupper(sense);
        if (sense.compare("MAX") == 0) {
          // Found MAX sense on OBJSENSE line
          obj_sense = ObjSense::kMaximize;
        } else if (sense.compare("MIN") == 0) {
          // Found MIN sense on OBJSENSE line
          obj_sense = ObjSense::kMinimize;
        }
        // Don't return HMpsFF::Parsekey::kNone; in case there's a
        // redefinition of OBJSENSE on the "proper" line. If there's
        // no such line, the ROWS keyword is read OK
      }
    }

    return key;
  }
  return HMpsFF::Parsekey::kFail;
}